

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valid.c
# Opt level: O1

void xmlDumpElementOccur(xmlBufferPtr buf,xmlElementContentPtr cur)

{
  uint uVar1;
  
  uVar1 = cur->ocur - XML_ELEMENT_CONTENT_OPT;
  if (uVar1 < 3) {
    xmlBufferWriteChar(buf,&DAT_001f7258 + *(int *)(&DAT_001f7258 + (ulong)uVar1 * 4));
    return;
  }
  return;
}

Assistant:

static void
xmlDumpElementOccur(xmlBufferPtr buf, xmlElementContentPtr cur) {
    switch (cur->ocur) {
        case XML_ELEMENT_CONTENT_ONCE:
            break;
        case XML_ELEMENT_CONTENT_OPT:
            xmlBufferWriteChar(buf, "?");
            break;
        case XML_ELEMENT_CONTENT_MULT:
            xmlBufferWriteChar(buf, "*");
            break;
        case XML_ELEMENT_CONTENT_PLUS:
            xmlBufferWriteChar(buf, "+");
            break;
    }
}